

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::PathSuffixSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind == EdgeSensitivePathSuffix) || (kind == SimplePathSuffix)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PathSuffixSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::EdgeSensitivePathSuffix:
        case SyntaxKind::SimplePathSuffix:
            return true;
        default:
            return false;
    }
}